

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O2

String __thiscall doctest::detail::getStreamResult(detail *this,ostream *in)

{
  char *local_30 [4];
  
  std::__cxx11::stringbuf::str();
  String::String((String *)this,local_30[0]);
  std::__cxx11::string::~string((string *)local_30);
  return (String)(char *)this;
}

Assistant:

String getStreamResult(std::ostream* in) {
        return static_cast<std::ostringstream*>(in)->str().c_str();
    }